

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O1

void __thiscall
btSoftRigidDynamicsWorld::addSoftBody
          (btSoftRigidDynamicsWorld *this,btSoftBody *body,short collisionFilterGroup,
          short collisionFilterMask)

{
  int iVar1;
  int iVar2;
  btSoftBody **ptr;
  btSoftBody **ppbVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  iVar1 = (this->m_softBodies).m_size;
  iVar2 = (this->m_softBodies).m_capacity;
  if (iVar1 == iVar2) {
    iVar6 = 1;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    if (iVar2 < iVar6) {
      if (iVar6 == 0) {
        ppbVar3 = (btSoftBody **)0x0;
      }
      else {
        ppbVar3 = (btSoftBody **)btAlignedAllocInternal((long)iVar6 << 3,0x10);
      }
      lVar4 = (long)(this->m_softBodies).m_size;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          ppbVar3[lVar5] = (this->m_softBodies).m_data[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      ptr = (this->m_softBodies).m_data;
      if (ptr != (btSoftBody **)0x0) {
        if ((this->m_softBodies).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_softBodies).m_data = (btSoftBody **)0x0;
      }
      (this->m_softBodies).m_ownsMemory = true;
      (this->m_softBodies).m_data = ppbVar3;
      (this->m_softBodies).m_capacity = iVar6;
    }
  }
  iVar1 = (this->m_softBodies).m_size;
  (this->m_softBodies).m_data[iVar1] = body;
  (this->m_softBodies).m_size = iVar1 + 1;
  body->m_softBodySolver = this->m_softBodySolver;
  btCollisionWorld::addCollisionObject
            ((btCollisionWorld *)this,&body->super_btCollisionObject,collisionFilterGroup,
             collisionFilterMask);
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::addSoftBody(btSoftBody* body,short int collisionFilterGroup,short int collisionFilterMask)
{
	m_softBodies.push_back(body);

	// Set the soft body solver that will deal with this body
	// to be the world's solver
	body->setSoftBodySolver( m_softBodySolver );

	btCollisionWorld::addCollisionObject(body,
		collisionFilterGroup,
		collisionFilterMask);

}